

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

ItemFlags __thiscall QFileSystemModel::flags(QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  bool bVar1;
  QFlagsStorage<Qt::ItemFlag> QVar2;
  Permissions PVar3;
  QFileSystemNode *node;
  
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  QVar2.i = QAbstractItemModel::flags((QModelIndex *)this);
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    node = QFileSystemModelPrivate::node(this_00,index);
    if ((this_00->nameFilterDisables == true) &&
       (bVar1 = QFileSystemModelPrivate::passNameFilters(this_00,node), !bVar1)) {
      return (ItemFlags)(QVar2.i & 0xffffffdf);
    }
    bVar1 = QFileSystemModelPrivate::QFileSystemNode::isDir(node);
    QVar2.i = (uint)!bVar1 << 7 | QVar2.i | 4;
    if (((this_00->readOnly == false) && (index->c == 0)) &&
       (PVar3 = QFileSystemModelPrivate::QFileSystemNode::permissions(node),
       ((uint)PVar3.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
              super_QFlagsStorage<QFileDevice::Permission>.i >> 9 & 1) != 0)) {
      bVar1 = QFileSystemModelPrivate::QFileSystemNode::isDir(node);
      QVar2.i = (uint)bVar1 << 3 | QVar2.i | 2;
    }
  }
  return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar2.i;
}

Assistant:

Qt::ItemFlags QFileSystemModel::flags(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    Qt::ItemFlags flags = QAbstractItemModel::flags(index);
    if (!index.isValid())
        return flags;

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    if (d->nameFilterDisables && !d->passNameFilters(indexNode)) {
        flags &= ~Qt::ItemIsEnabled;
        // ### TODO you shouldn't be able to set this as the current item, task 119433
        return flags;
    }

    flags |= Qt::ItemIsDragEnabled;

    if (!indexNode->isDir())
        flags |= Qt::ItemNeverHasChildren;
    if (d->readOnly)
        return flags;
    if ((index.column() == 0) && indexNode->permissions() & QFile::WriteUser) {
        flags |= Qt::ItemIsEditable;
        if (indexNode->isDir())
            flags |= Qt::ItemIsDropEnabled;
    }
    return flags;
}